

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::WildcardPattern::normaliseString
          (string *__return_storage_ptr__,WildcardPattern *this,string *str)

{
  string local_40;
  string *local_20;
  string *str_local;
  WildcardPattern *this_local;
  
  local_20 = str;
  str_local = (string *)this;
  this_local = (WildcardPattern *)__return_storage_ptr__;
  if (this->m_caseSensitivity == No) {
    toLower(&local_40,str);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,(string *)str);
  }
  trim(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string WildcardPattern::normaliseString( std::string const& str ) const {
        return trim( m_caseSensitivity == CaseSensitive::No ? toLower( str ) : str );
    }